

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_result
spvc_compiler_create_compiler_options(spvc_compiler compiler,spvc_compiler_options *options)

{
  spvc_backend sVar1;
  Compiler *pCVar2;
  undefined8 uVar3;
  spvc_context psVar4;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint32_t *puVar8;
  _Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_> _Var9;
  Options *pOVar10;
  spvc_result sVar11;
  undefined1 *local_60 [2];
  undefined1 local_50 [48];
  
  _Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
       (_Head_base<0UL,_ScratchMemoryAllocation_*,_false>)
       operator_new(0xd8,(nothrow_t *)&std::nothrow);
  if (_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl ==
      (ScratchMemoryAllocation *)0x0) {
    psVar4 = compiler->context;
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Out of memory.","");
    std::__cxx11::string::operator=((string *)psVar4,(string *)local_60);
    if (psVar4->callback != (spvc_error_callback)0x0) {
      (*psVar4->callback)(psVar4->callback_userdata,(psVar4->last_error)._M_dataplus._M_p);
    }
    sVar11 = SPVC_ERROR_OUT_OF_MEMORY;
    if (local_60[0] != local_50) {
      operator_delete(local_60[0]);
    }
  }
  else {
    *(undefined ***)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl =
         &PTR__ScratchMemoryAllocation_0048fa40;
    puVar8 = (uint32_t *)
             ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0x14);
    *(uint32_t *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x14) =
         0x1c2;
    *(undefined2 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x18) = 0;
    *(uint32_t *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x1c) = 3;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x20) =
         0x100000001000000;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x28) =
         0x1000000;
    ((VertexOptions *)
    ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x30U))->
    fixup_clipspace = false;
    ((VertexOptions *)
    ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x30U))->
    flip_vert_y = false;
    *(bool *)((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0x32) = true;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x34) =
         0x300000002;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x3c) =
         0x27d800000001;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x44) =
         0x400001000;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x4c) =
         0x1e0000ffff;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x54) =
         0x1c0000001d;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x5c) =
         0x1a0000001b;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 100) =
         0x1800000019;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x6c) =
         0x1600000017;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x74) =
         0x1400000015;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x7c) = 0;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x84) =
         0xffffffffffffffff;
    *(undefined2 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x8c) =
         0x101;
    *(bool *)((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0x8e) = true;
    *(undefined4 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x8f) = 0;
    *(bool *)((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0x93) = false;
    *(bool *)((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0x94) = true;
    *(undefined4 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x95) = 0;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x9c) = 0;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xa4) = 0;
    *(bool *)((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0xac) = true;
    *(undefined4 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xad) = 0;
    *(undefined2 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xb1) = 0;
    *(bool *)((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0xbc) = false;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xb4) = 0;
    *(undefined4 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xbd) =
         0x1000001;
    *(bool *)((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0xc5) = false;
    *(undefined4 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xc1) = 0;
    ((Options *)
    ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 200))->
    shader_model = 0x1e;
    *(bool *)((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0xd4) = false;
    *(undefined8 *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xcc) = 0;
    *(spvc_context *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 8) =
         compiler->context;
    *(uint32_t *)
     ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) = 0;
    sVar1 = compiler->backend;
    if (sVar1 == SPVC_BACKEND_GLSL) {
      *(uint32_t *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) =
           0x3000000;
      pCVar2 = (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x34) =
           *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x34);
      uVar3 = *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x14);
      uVar6 = *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x1c);
      uVar7 = *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x2c);
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x24) =
           *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x24);
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x2c) =
           uVar7;
      *(undefined8 *)puVar8 = uVar3;
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x1c) =
           uVar6;
    }
    else if (sVar1 == SPVC_BACKEND_HLSL) {
      pOVar10 = (Options *)
                ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
                200);
      *(uint32_t *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) =
           0x5000000;
      pCVar2 = (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x34) =
           *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x34);
      uVar3 = *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x14);
      uVar6 = *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x1c);
      uVar7 = *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x2c);
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x24) =
           *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x24);
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x2c) =
           uVar7;
      *(undefined8 *)puVar8 = uVar3;
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x1c) =
           uVar6;
      uVar3 = *(undefined8 *)((long)pCVar2[3].ir.ids_for_type + 0x28);
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0xcd) =
           *(undefined8 *)((long)pCVar2[3].ir.ids_for_type + 0x2d);
      pOVar10->shader_model = (int)uVar3;
      pOVar10->point_size_compat = (bool)(char)((ulong)uVar3 >> 0x20);
      pOVar10->point_coord_compat = (bool)(char)((ulong)uVar3 >> 0x28);
      pOVar10->support_nonzero_base_vertex_base_instance = (bool)(char)((ulong)uVar3 >> 0x30);
      pOVar10->force_storage_buffer_as_uav = (bool)(char)((ulong)uVar3 >> 0x38);
    }
    else if (sVar1 == SPVC_BACKEND_MSL) {
      *(uint32_t *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x10) =
           0x9000000;
      pCVar2 = (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x34) =
           *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x34);
      uVar3 = *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x14);
      uVar6 = *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x1c);
      uVar7 = *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x2c);
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x24) =
           *(undefined8 *)((long)&pCVar2[2].ir.declared_capabilities + 0x24);
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x2c) =
           uVar7;
      *(undefined8 *)puVar8 = uVar3;
      *(undefined8 *)
       ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl + 0x1c) =
           uVar6;
      memcpy((Precision *)
             ((long)_Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl +
             0x3c),(void *)((long)pCVar2[3].ir.ids_for_type + 0xe4),0x8a);
    }
    *options = (spvc_compiler_options)
               _Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
    psVar4 = compiler->context;
    spirv_cross::
    SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
    ::reserve(&psVar4->allocations,
              (psVar4->allocations).
              super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
              .buffer_size + 1);
    sVar5 = (psVar4->allocations).
            super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
            .buffer_size;
    (psVar4->allocations).
    super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
    .ptr[sVar5]._M_t.
    super___uniq_ptr_impl<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>.
    _M_t.
    super__Tuple_impl<0UL,_ScratchMemoryAllocation_*,_std::default_delete<ScratchMemoryAllocation>_>
    .super__Head_base<0UL,_ScratchMemoryAllocation_*,_false> =
         _Var9.super__Head_base<0UL,_ScratchMemoryAllocation_*,_false>._M_head_impl;
    (psVar4->allocations).
    super_VectorView<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>_>
    .buffer_size = sVar5 + 1;
    sVar11 = SPVC_SUCCESS;
  }
  return sVar11;
}

Assistant:

spvc_result spvc_compiler_create_compiler_options(spvc_compiler compiler, spvc_compiler_options *options)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_compiler_options_s> opt(new (std::nothrow) spvc_compiler_options_s);
		if (!opt)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		opt->context = compiler->context;
		opt->backend_flags = 0;
		switch (compiler->backend)
		{
#if SPIRV_CROSS_C_API_MSL
		case SPVC_BACKEND_MSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_MSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerMSL *>(compiler->compiler.get())->get_common_options();
			opt->msl = static_cast<CompilerMSL *>(compiler->compiler.get())->get_msl_options();
			break;
#endif

#if SPIRV_CROSS_C_API_HLSL
		case SPVC_BACKEND_HLSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_HLSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerHLSL *>(compiler->compiler.get())->get_common_options();
			opt->hlsl = static_cast<CompilerHLSL *>(compiler->compiler.get())->get_hlsl_options();
			break;
#endif

#if SPIRV_CROSS_C_API_GLSL
		case SPVC_BACKEND_GLSL:
			opt->backend_flags |= SPVC_COMPILER_OPTION_GLSL_BIT | SPVC_COMPILER_OPTION_COMMON_BIT;
			opt->glsl = static_cast<CompilerGLSL *>(compiler->compiler.get())->get_common_options();
			break;
#endif

		default:
			break;
		}

		*options = opt.get();
		compiler->context->allocations.push_back(std::move(opt));
	}